

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O3

void test_qclab_dense_kron<float>(void)

{
  float *pfVar1;
  float fVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_type_conflict j;
  long lVar9;
  undefined8 *puVar10;
  pointer *__ptr;
  long lVar11;
  char *in_R9;
  pointer *__ptr_1;
  pointer *__ptr_3;
  pointer *__ptr_2;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  _Head_base<0UL,_float_*,_false> local_e0;
  SquareMatrix<float> local_d8;
  string local_c8;
  internal local_a8;
  undefined7 uStack_a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  void *local_90;
  internal local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  AssertHelper local_78;
  Message local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  SquareMatrix<float> local_60;
  long local_50;
  void *local_48;
  SquareMatrix<float> local_40;
  
  local_60.size_ = 2;
  local_60.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_60.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3f800000;
  *(undefined8 *)
   ((long)local_60.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x3f80000000000000;
  local_40.size_ = 2;
  local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x3f80000000000000;
  *(undefined8 *)
   ((long)local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x3f800000;
  qclab::dense::kron<float>((dense *)&local_50,&local_60,&local_40);
  puVar3 = (undefined8 *)operator_new__(0x40);
  *puVar3 = 0x3f80000000000000;
  puVar3[1] = 0;
  *(undefined4 *)(puVar3 + 2) = 0x3f800000;
  *(undefined8 *)((long)puVar3 + 0x14) = 0;
  *(undefined8 *)((long)puVar3 + 0x1c) = 0;
  *(undefined8 *)((long)puVar3 + 0x24) = 0;
  *(undefined8 *)((long)puVar3 + 0x2c) = 0x3f800000;
  *(undefined8 *)((long)puVar3 + 0x34) = 0x3f80000000000000;
  *(undefined4 *)((long)puVar3 + 0x3c) = 0;
  if (local_50 == 4) {
    lVar9 = 0;
    pvVar4 = local_48;
    puVar5 = puVar3;
    do {
      lVar11 = 0;
      do {
        fVar2 = *(float *)((long)puVar5 + lVar11 * 4);
        pfVar1 = (float *)((long)pvVar4 + lVar11 * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_0018ff80;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar9 = lVar9 + 1;
      pvVar4 = (void *)((long)pvVar4 + 0x10);
      puVar5 = puVar5 + 2;
    } while (lVar9 != 4);
  }
  else {
LAB_0018ff80:
    local_88 = (internal)0x0;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_88,(AssertionResult *)"IoX == IoX_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
  }
  qclab::dense::kron<float>((dense *)&local_88,&local_40,&local_60);
  puVar5 = (undefined8 *)operator_new__(0x40);
  *puVar5 = 0;
  *(undefined4 *)(puVar5 + 1) = 0x3f800000;
  *(undefined8 *)((long)puVar5 + 0xc) = 0;
  *(undefined8 *)((long)puVar5 + 0x14) = 0;
  *(undefined8 *)((long)puVar5 + 0x1c) = 0x3f8000003f800000;
  *(undefined8 *)((long)puVar5 + 0x24) = 0;
  *(undefined8 *)((long)puVar5 + 0x2c) = 0;
  *(undefined8 *)((long)puVar5 + 0x34) = 0x3f800000;
  *(undefined4 *)((long)puVar5 + 0x3c) = 0;
  if (CONCAT71(uStack_87,local_88) == 4) {
    lVar9 = 0;
    pbVar8 = local_80;
    puVar6 = puVar5;
    do {
      lVar11 = 0;
      do {
        fVar2 = *(float *)((long)puVar6 + lVar11 * 4);
        pfVar1 = (float *)((long)&(pbVar8->_M_dataplus)._M_p + lVar11 * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_001900d5;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar9 = lVar9 + 1;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar8->field_2
      ;
      puVar6 = puVar6 + 2;
    } while (lVar9 != 4);
  }
  else {
LAB_001900d5:
    local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffffffffff00);
    local_e0._M_head_impl = (float *)0x0;
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_e8,(AssertionResult *)"XoI == XoI_check","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_d8.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_d8.size_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_e0._M_head_impl);
    }
  }
  local_e8 = (undefined1  [8])0x2;
  local_e0._M_head_impl = (float *)operator_new__(0x10);
  *(undefined8 *)local_e0._M_head_impl = 0x404000003f800000;
  *(undefined8 *)((long)local_e0._M_head_impl + 8) = 0x40a0000040000000;
  local_d8.size_ = 2;
  local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x10);
  *(undefined8 *)
   local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
   super__Head_base<0UL,_float_*,_false>._M_head_impl = 0x4150000040e00000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0x4188000041300000;
  qclab::dense::kron<float>((dense *)&local_98,(SquareMatrix<float> *)local_e8,&local_d8);
  puVar6 = (undefined8 *)operator_new__(0x40);
  *puVar6 = 0x4150000040e00000;
  puVar6[1] = 0x421c000041a80000;
  puVar6[2] = 0x4188000041300000;
  puVar6[3] = 0x424c000042040000;
  puVar6[4] = 0x41d0000041600000;
  puVar6[5] = 0x42820000420c0000;
  puVar6[6] = 0x4208000041b00000;
  puVar6[7] = 0x42aa0000425c0000;
  if (local_98.data_ == (AssertHelperData *)&DAT_00000004) {
    lVar9 = 0;
    pvVar4 = local_90;
    puVar7 = puVar6;
    do {
      lVar11 = 0;
      do {
        fVar2 = *(float *)((long)puVar7 + lVar11 * 4);
        pfVar1 = (float *)((long)pvVar4 + lVar11 * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_0019025c;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar9 = lVar9 + 1;
      pvVar4 = (void *)((long)pvVar4 + 0x10);
      puVar7 = puVar7 + 2;
    } while (lVar9 != 4);
  }
  else {
LAB_0019025c:
    local_a8 = (internal)0x0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_a8,(AssertionResult *)"AoB == AoB_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  qclab::dense::kron<float>((dense *)&local_a8,&local_d8,(SquareMatrix<float> *)local_e8);
  puVar7 = (undefined8 *)operator_new__(0x40);
  *puVar7 = 0x41a8000040e00000;
  puVar7[1] = 0x421c000041500000;
  puVar7[2] = 0x420c000041600000;
  puVar7[3] = 0x4282000041d00000;
  puVar7[4] = 0x4204000041300000;
  puVar7[5] = 0x424c000041880000;
  puVar7[6] = 0x425c000041b00000;
  puVar7[7] = 0x42aa000042080000;
  if (CONCAT71(uStack_a7,local_a8) == 4) {
    lVar9 = 0;
    pbVar8 = local_a0;
    puVar10 = puVar7;
    do {
      lVar11 = 0;
      do {
        fVar2 = *(float *)((long)puVar10 + lVar11 * 4);
        pfVar1 = (float *)((long)&(pbVar8->_M_dataplus)._M_p + lVar11 * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_001903a7;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar9 = lVar9 + 1;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar8->field_2
      ;
      puVar10 = puVar10 + 2;
    } while (lVar9 != 4);
  }
  else {
LAB_001903a7:
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)0x0;
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&local_70,(AssertionResult *)"BoA == BoA_check","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  operator_delete__(puVar7);
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a0);
  }
  operator_delete__(puVar6);
  if (local_90 != (void *)0x0) {
    operator_delete__(local_90);
  }
  if (local_d8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)local_e0._M_head_impl !=
      (float *)0x0) {
    operator_delete__(local_e0._M_head_impl);
  }
  operator_delete__(puVar5);
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_80);
  }
  operator_delete__(puVar3);
  if (local_48 != (void *)0x0) {
    operator_delete__(local_48);
  }
  if (local_40.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_40.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if (local_60.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_60.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}